

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramGenerator.cpp
# Opt level: O3

void __thiscall
rsg::ProgramGenerator::generate
          (ProgramGenerator *this,ProgramParameters *programParams,Shader *vertexShader,
          Shader *fragmentShader)

{
  ProgramParameters *pPVar1;
  int iVar2;
  GeneratorState *pGVar3;
  pointer ppSVar4;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> emptyOutputs;
  ShaderGenerator shaderGen;
  Random rnd;
  GeneratorState state;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> local_138;
  ShaderGenerator local_118;
  deRandom local_a8;
  GeneratorState local_98;
  
  deRandom_init(&local_a8,programParams->seed);
  GeneratorState::GeneratorState(&local_98,programParams,(Random *)&local_a8);
  ShaderGenerator::ShaderGenerator(&local_118,&local_98);
  local_138.super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderGenerator::generate(&local_118,&programParams->fragmentParameters,fragmentShader,&local_138)
  ;
  if (local_138.super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ShaderGenerator::~ShaderGenerator(&local_118);
  ShaderGenerator::ShaderGenerator(&local_118,&local_98);
  ShaderGenerator::generate
            (&local_118,&programParams->vertexParameters,vertexShader,&fragmentShader->m_inputs);
  ShaderGenerator::~ShaderGenerator(&local_118);
  local_118.m_state = (GeneratorState *)0x0;
  local_118.m_varManager.m_variableScopeStack.
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.m_varManager.m_variableScopeStack.
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppSVar4 = (vertexShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 !=
      (vertexShader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
        if (local_118.m_varManager.m_variableScopeStack.
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_118.m_varManager.m_variableScopeStack.
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
          _M_realloc_insert<rsg::ShaderInput*const&>
                    ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)&local_118,
                     (iterator)
                     local_118.m_varManager.m_variableScopeStack.
                     super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppSVar4);
        }
        else {
          *local_118.m_varManager.m_variableScopeStack.
           super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
           super__Vector_impl_data._M_start = (VariableScope *)*ppSVar4;
          local_118.m_varManager.m_variableScopeStack.
          super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_118.m_varManager.m_variableScopeStack.
               super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 !=
             (vertexShader->m_uniforms).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppSVar4 = (fragmentShader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 !=
      (fragmentShader->m_uniforms).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((((*ppSVar4)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
        if (local_118.m_varManager.m_variableScopeStack.
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_118.m_varManager.m_variableScopeStack.
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>::
          _M_realloc_insert<rsg::ShaderInput*const&>
                    ((vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>> *)&local_118,
                     (iterator)
                     local_118.m_varManager.m_variableScopeStack.
                     super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppSVar4);
        }
        else {
          *local_118.m_varManager.m_variableScopeStack.
           super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
           super__Vector_impl_data._M_start = (VariableScope *)*ppSVar4;
          local_118.m_varManager.m_variableScopeStack.
          super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_118.m_varManager.m_variableScopeStack.
               super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 !=
             (fragmentShader->m_uniforms).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_118.m_state !=
      (GeneratorState *)
      local_118.m_varManager.m_variableScopeStack.
      super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar2 = 0;
    pGVar3 = local_118.m_state;
    do {
      pPVar1 = pGVar3->m_programParams;
      if ((((*(Variable **)&pPVar1->seed)->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
        ((((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)
          &(pPVar1->vertexParameters).randomize)->_M_impl).super__Vector_impl_data._M_start)->intVal
             = iVar2;
        ((((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)
          &(pPVar1->vertexParameters).maxInputVariables)->
         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>)._M_impl.
         super__Vector_impl_data._M_start)->intVal = iVar2;
        iVar2 = iVar2 + 1;
      }
      pGVar3 = (GeneratorState *)&pGVar3->m_random;
    } while (pGVar3 != (GeneratorState *)
                       local_118.m_varManager.m_variableScopeStack.
                       super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.m_state != (GeneratorState *)0x0) {
    operator_delete(local_118.m_state,
                    (long)local_118.m_varManager.m_variableScopeStack.
                          super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_118.m_state);
  }
  GeneratorState::~GeneratorState(&local_98);
  return;
}

Assistant:

void ProgramGenerator::generate (
	const ProgramParameters&	programParams,
	Shader&						vertexShader,
	Shader&						fragmentShader)
{
	// Random number generator
	de::Random rnd(programParams.seed);

	GeneratorState state(programParams, rnd);

	// Fragment shader
	{
		ShaderGenerator			shaderGen(state);
		vector<ShaderInput*>	emptyOutputs; // \note [pyry] gl_FragColor is added in ShaderGenerator
		shaderGen.generate(programParams.fragmentParameters, fragmentShader, emptyOutputs);
	}

	// Vertex shader
	{
		ShaderGenerator shaderGen(state);

		// Initialize outputs from fragment shader inputs
		const vector<ShaderInput*>& fragmentInputs = fragmentShader.getInputs(); // \note gl_Position and dEQP_Position are handled in ShaderGenerator

		shaderGen.generate(programParams.vertexParameters, vertexShader, fragmentInputs);
	}

	// Allocate samplers \todo [pyry] Randomize allocation.
	{
		const vector<ShaderInput*>&		vertexUniforms		= vertexShader.getUniforms();
		const vector<ShaderInput*>&		fragmentUniforms	= fragmentShader.getUniforms();
		vector<ShaderInput*>			unifiedSamplers;
		int								curSamplerNdx	= 0;

		// Build unified sampler list.
		for (vector<ShaderInput*>::const_iterator i = vertexUniforms.begin(); i != vertexUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		for (vector<ShaderInput*>::const_iterator i = fragmentUniforms.begin(); i != fragmentUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		// Assign sampler indices.
		for (vector<ShaderInput*>::const_iterator i = unifiedSamplers.begin(); i != unifiedSamplers.end(); i++)
		{
			ShaderInput* input = *i;
			if (input->getVariable()->getType().isSampler())
			{
				input->getValueRange().getMin() = curSamplerNdx;
				input->getValueRange().getMax() = curSamplerNdx;
				curSamplerNdx += 1;
			}
		}
	}
}